

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddRanlibRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  char *pcVar4;
  ostream *poVar5;
  string ranlib;
  allocator local_6a;
  allocator local_69;
  string local_68;
  string local_48;
  
  TVar3 = cmGeneratorTarget::GetType(this->Target);
  if (TVar3 == STATIC_LIBRARY) {
    pcVar1 = this->Target->Target->Makefile;
    std::__cxx11::string::string((string *)&local_68,"APPLE",(allocator *)&local_48);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar2) {
      pcVar1 = this->Target->Target->Makefile;
      std::__cxx11::string::string((string *)&local_48,"CMAKE_RANLIB",&local_69);
      pcVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_48);
      std::__cxx11::string::string((string *)&local_68,pcVar4,&local_6a);
      std::__cxx11::string::~string((string *)&local_48);
      if (local_68._M_string_length != 0) {
        poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
        poVar5 = std::operator<<(poVar5,"execute_process(COMMAND \"");
        poVar5 = std::operator<<(poVar5,(string *)&local_68);
        poVar5 = std::operator<<(poVar5,"\" \"");
        poVar5 = std::operator<<(poVar5,(string *)toDestDirPath);
        std::operator<<(poVar5,"\")\n");
      }
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddRanlibRule(std::ostream& os, Indent indent,
                                             const std::string& toDestDirPath)
{
  // Static libraries need ranlib on this platform.
  if (this->Target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    return;
  }

  // Perform post-installation processing on the file depending
  // on its type.
  if (!this->Target->Target->GetMakefile()->IsOn("APPLE")) {
    return;
  }

  std::string ranlib =
    this->Target->Target->GetMakefile()->GetRequiredDefinition("CMAKE_RANLIB");
  if (ranlib.empty()) {
    return;
  }

  os << indent << "execute_process(COMMAND \"" << ranlib << "\" \""
     << toDestDirPath << "\")\n";
}